

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O2

string * __thiscall
soul::getDescriptionOfTimeInSeconds_abi_cxx11_
          (string *__return_storage_ptr__,soul *this,double numSeconds)

{
  size_t in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (numSeconds < 1.0) {
    getDescriptionOfTimeInSeconds[abi:cxx11](double)::$_0::operator()[abi_cxx11_
              (&local_30,(void *)((ulong)(numSeconds < 0.1) + 1),numSeconds * 1000.0,in_RDX);
    std::operator+(__return_storage_ptr__,&local_30," ms");
  }
  else {
    getDescriptionOfTimeInSeconds[abi:cxx11](double)::$_0::operator()[abi_cxx11_
              (&local_30,(void *)0x2,numSeconds,in_RDX);
    std::operator+(__return_storage_ptr__,&local_30," sec");
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string getDescriptionOfTimeInSeconds (double numSeconds)
{
    auto toStringWithDecPlaces = [] (double n, size_t numDecPlaces)
    {
        auto s = choc::text::floatToString (n, (int) numDecPlaces);
        auto dot = s.find ('.');
        return dot == std::string::npos ? s : s.substr (0, std::min (s.length(), dot + 1 + numDecPlaces));
    };

    return numSeconds < 1.0 ? (toStringWithDecPlaces (numSeconds * 1000.0, numSeconds < 0.1 ? 2 : 1) + " ms")
                            : (toStringWithDecPlaces (numSeconds, 2) + " sec");
}